

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void fill_rooms(level *lev)

{
  int local_18;
  int local_14;
  int m;
  int tmpi;
  level *lev_local;
  
  for (local_14 = 0; local_14 < lev->nroom; local_14 = local_14 + 1) {
    if (lev->rooms[local_14].needfill != '\0') {
      fill_room(lev,lev->rooms + local_14,lev->rooms[local_14].needfill == '\x02');
    }
    for (local_18 = 0; local_18 < lev->rooms[local_14].nsubrooms; local_18 = local_18 + 1) {
      if (lev->rooms[local_14].sbrooms[local_18]->needfill != '\0') {
        fill_room(lev,lev->rooms[local_14].sbrooms[local_18],'\0');
      }
    }
  }
  return;
}

Assistant:

static void fill_rooms(struct level *lev)
{
	int tmpi;
	for (tmpi = 0; tmpi < lev->nroom; tmpi++) {
	    int m;

	    if (lev->rooms[tmpi].needfill)
		fill_room(lev, &lev->rooms[tmpi], (lev->rooms[tmpi].needfill == 2));

	    for (m = 0; m < lev->rooms[tmpi].nsubrooms; m++)
		if (lev->rooms[tmpi].sbrooms[m]->needfill)
		    fill_room(lev, lev->rooms[tmpi].sbrooms[m], FALSE);
	}
}